

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pru_impl.cpp
# Opt level: O0

void __thiscall ui::Pru::Fetch(Pru *this)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  path local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  path local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_ifstream<char,_std::char_traits<char>_> local_678 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_ifstream<char,_std::char_traits<char>_> local_450 [536];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_ifstream<char,_std::char_traits<char>_> local_218 [520];
  Pru *local_10;
  Pru *this_local;
  
  local_10 = this;
  std::operator+(&local_238,&this->path_,"/name");
  std::ifstream::ifstream(local_218,(string *)&local_238,_S_in);
  std::operator>>(local_218,&this->name_);
  std::ifstream::~ifstream(local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::operator+(&local_470,&this->path_,"/firmware");
  std::ifstream::ifstream(local_450,(string *)&local_470,_S_in);
  std::operator>>(local_450,&this->firmware_);
  std::ifstream::~ifstream(local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::operator+(&local_698,&this->path_,"/state");
  std::ifstream::ifstream(local_678,(string *)&local_698,_S_in);
  std::operator>>(local_678,&this->state_);
  std::ifstream::~ifstream(local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::operator+(&local_6e0,"/lib/firmware/",&this->firmware_);
  std::filesystem::__cxx11::path::path(&local_6c0,&local_6e0,auto_format);
  bVar1 = std::filesystem::exists(&local_6c0);
  std::filesystem::__cxx11::path::~path(&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  if (bVar1) {
    std::operator+(&local_728,"/lib/firmware/",&this->firmware_);
    std::filesystem::__cxx11::path::path(&local_708,&local_728,auto_format);
    lVar2 = std::filesystem::file_size(&local_708);
    std::filesystem::__cxx11::path::~path(&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    if (lVar2 == 0) {
      std::operator+(&local_768," Warning: ",&this->firmware_);
      std::operator+(&local_748,&local_768," Empty");
      std::__cxx11::string::operator=((string *)&this->info_,(string *)&local_748);
      std::__cxx11::string::~string((string *)&local_748);
      std::__cxx11::string::~string((string *)&local_768);
    }
    else {
      std::operator+(&local_788," Loaded Firmware: ",&this->firmware_);
      std::__cxx11::string::operator=((string *)&this->info_,(string *)&local_788);
      std::__cxx11::string::~string((string *)&local_788);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->info_," Firmware Not found / Not Supported");
  }
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/name") >> name_;
    std::ifstream(path_ + "/firmware") >> firmware_;
    std::ifstream(path_ + "/state") >> state_;
    if (std::filesystem::exists("/lib/firmware/" + firmware_)) {
      if (std::filesystem::file_size("/lib/firmware/" + firmware_) == 0) {
        info_ = " Warning: " + firmware_ + " Empty";
      } else {
        info_ = " Loaded Firmware: " + firmware_;
      }
    } else {
      info_ = " Firmware Not found / Not Supported";
    }
  }